

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O2

void __thiscall EmitPrettyPrint::flush(EmitPrettyPrint *this)

{
  int iVar1;
  int iVar2;
  TokenSplit *pTVar3;
  LowlevelError *this_00;
  allocator local_39;
  string local_38;
  
  while( true ) {
    iVar1 = (this->tokqueue).left;
    iVar2 = (this->tokqueue).max;
    if (iVar1 == ((this->tokqueue).right + 1) % iVar2) {
      this->needbreak = false;
      (*this->lowlevel->_vptr_EmitXml[0x26])();
      return;
    }
    (this->tokqueue).left = (iVar1 + 1) % iVar2;
    pTVar3 = (this->tokqueue).cache;
    if (pTVar3[iVar1].size < 0) break;
    print(this,pTVar3 + iVar1);
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            ((string *)&local_38,"Cannot flush pretty printer. Missing group end",&local_39);
  LowlevelError::LowlevelError(this_00,&local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void EmitPrettyPrint::flush(void)

{
  while(!tokqueue.empty()) {
    TokenSplit &tok( tokqueue.popbottom() );
    if (tok.getSize() < 0)
      throw LowlevelError("Cannot flush pretty printer. Missing group end");
    print(tok);
  }
  needbreak = false;
#ifdef PRETTY_DEBUG
  if (!scanqueue.empty())
    throw LowlevelError("prettyprint scanqueue did not flush");
  if (!indentstack.empty())
    throw LowlevelError("prettyprint indentstack did not flush");
#endif
  lowlevel->flush();
}